

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O0

int __thiscall XInputSimulatorImplLinux::charToKeyCode(XInputSimulatorImplLinux *this,char key_char)

{
  byte bVar1;
  ostream *poVar2;
  int keyCode;
  char key_char_local;
  XInputSimulatorImplLinux *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"cchar: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)key_char);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = XKeysymToKeycode(this->display,(long)key_char);
  poVar2 = std::operator<<((ostream *)&std::cout,"ccode: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)bVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return (uint)bVar1;
}

Assistant:

int XInputSimulatorImplLinux::charToKeyCode(char key_char)
{
    std::cout << "cchar: " << (int)key_char << std::endl;

    int keyCode = XKeysymToKeycode(display, key_char);
//    int keyCode = XKeysymToKeycode(display, XStringToKeysym(&key_char));
    std::cout << "ccode: " << keyCode << std::endl;

    return keyCode;
}